

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::element_at(RepeatedPtrFieldBase *this,int index)

{
  bool bVar1;
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar2;
  Rep *pRVar3;
  LogMessage local_40;
  Voidify local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  RepeatedPtrFieldBase *pRStack_18;
  int index_local;
  RepeatedPtrFieldBase *this_local;
  
  absl_log_internal_check_op_result._4_4_ = index;
  pRStack_18 = this;
  bVar1 = using_sso(this);
  if (bVar1) {
    v1 = absl::lts_20250127::log_internal::GetReferenceableValue
                   (absl_log_internal_check_op_result._4_4_);
    v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
    local_28 = absl::lts_20250127::log_internal::Check_EQImpl(v1,v2,"index == 0");
    this_local = this;
    if (local_28 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x29c,failure_msg);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
  }
  else {
    pRVar3 = rep(this);
    this_local = (RepeatedPtrFieldBase *)
                 (pRVar3->elements + absl_log_internal_check_op_result._4_4_);
  }
  return &this_local->tagged_rep_or_elem_;
}

Assistant:

void*& element_at(int index) {
    if (using_sso()) {
      ABSL_DCHECK_EQ(index, 0);
      return tagged_rep_or_elem_;
    }
    return rep()->elements[index];
  }